

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_warc.c
# Opt level: O3

char * xmemmem(char *hay,size_t haysize,char *needle,size_t needlesize)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  byte *pbVar4;
  byte *__s1;
  byte bVar5;
  char *pcVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte bVar9;
  
  pbVar4 = (byte *)memchr(hay,(int)*needle,haysize);
  if (pbVar4 != (byte *)0x0) {
    pbVar7 = (byte *)(hay + haysize);
    __s1 = pbVar4 + 1;
    if ((long)needlesize < 2 || pbVar7 <= __s1) {
      if ((long)needlesize < 2) {
        return (char *)pbVar4;
      }
      return (char *)0x0;
    }
    bVar9 = *pbVar4;
    bVar1 = true;
    pcVar2 = needle + 2;
    pbVar8 = __s1;
    bVar5 = bVar9;
    do {
      pcVar6 = pcVar2;
      bVar5 = bVar5 ^ *pbVar8;
      bVar9 = bVar9 ^ pcVar6[-1];
      if (*pbVar8 != pcVar6[-1]) {
        bVar1 = false;
      }
      pbVar8 = pbVar8 + 1;
    } while ((pbVar8 < pbVar7) && (pcVar2 = pcVar6 + 1, pcVar6 < needle + needlesize));
    if (pcVar6 < needle + needlesize) {
      return (char *)0x0;
    }
    if (bVar1) {
      return (char *)pbVar4;
    }
    if (pbVar8 < pbVar7) {
      while ((bVar5 = *pbVar8 ^ __s1[-1] ^ bVar5, bVar5 != bVar9 ||
             (iVar3 = bcmp(__s1,needle,needlesize - 1), iVar3 != 0))) {
        pbVar8 = pbVar8 + 1;
        __s1 = __s1 + 1;
        if (pbVar7 <= pbVar8) {
          return (char *)0x0;
        }
      }
      return (char *)__s1;
    }
  }
  return (char *)0x0;
}

Assistant:

static char*
xmemmem(const char *hay, const size_t haysize,
	const char *needle, const size_t needlesize)
{
	const char *const eoh = hay + haysize;
	const char *const eon = needle + needlesize;
	const char *hp;
	const char *np;
	const char *cand;
	unsigned int hsum;
	unsigned int nsum;
	unsigned int eqp;

	/* trivial checks first
         * a 0-sized needle is defined to be found anywhere in haystack
         * then run strchr() to find a candidate in HAYSTACK (i.e. a portion
         * that happens to begin with *NEEDLE) */
	if (needlesize == 0UL) {
		return deconst(hay);
	} else if ((hay = memchr(hay, *needle, haysize)) == NULL) {
		/* trivial */
		return NULL;
	}

	/* First characters of haystack and needle are the same now. Both are
	 * guaranteed to be at least one character long.  Now computes the sum
	 * of characters values of needle together with the sum of the first
	 * needle_len characters of haystack. */
	for (hp = hay + 1U, np = needle + 1U, hsum = *hay, nsum = *hay, eqp = 1U;
	     hp < eoh && np < eon;
	     hsum ^= *hp, nsum ^= *np, eqp &= *hp == *np, hp++, np++);

	/* HP now references the (NEEDLESIZE + 1)-th character. */
	if (np < eon) {
		/* haystack is smaller than needle, :O */
		return NULL;
	} else if (eqp) {
		/* found a match */
		return deconst(hay);
	}

	/* now loop through the rest of haystack,
	 * updating the sum iteratively */
	for (cand = hay; hp < eoh; hp++) {
		hsum ^= *cand++;
		hsum ^= *hp;

		/* Since the sum of the characters is already known to be
		 * equal at that point, it is enough to check just NEEDLESIZE - 1
		 * characters for equality,
		 * also CAND is by design < HP, so no need for range checks */
		if (hsum == nsum && memcmp(cand, needle, needlesize - 1U) == 0) {
			return deconst(cand);
		}
	}
	return NULL;
}